

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  CppType CVar1;
  int iVar2;
  LogMessage LStack_18;
  
  if (this->is_repeated != false) {
    CVar1 = anon_unknown_59::cpp_type(this->type);
    switch(CVar1) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      iVar2 = RepeatedField<int>::size(this->field_0);
      return iVar2;
    case CPPTYPE_INT64:
      iVar2 = RepeatedField<long>::size(this->field_0);
      return iVar2;
    case CPPTYPE_UINT32:
      iVar2 = RepeatedField<unsigned_int>::size(this->field_0);
      return iVar2;
    case CPPTYPE_UINT64:
      iVar2 = RepeatedField<unsigned_long>::size(this->field_0);
      return iVar2;
    case CPPTYPE_DOUBLE:
      iVar2 = RepeatedField<double>::size(this->field_0);
      return iVar2;
    case CPPTYPE_FLOAT:
      iVar2 = RepeatedField<float>::size(this->field_0);
      return iVar2;
    case CPPTYPE_BOOL:
      iVar2 = RepeatedField<bool>::size(this->field_0);
      return iVar2;
    case CPPTYPE_STRING:
    case CPPTYPE_MESSAGE:
      return *(int *)((this->field_0).int64_t_value + 8);
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x65a);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_18,(char (*) [16])"Can\'t get here.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_18);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x647,"is_repeated");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  ABSL_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return ptr.repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return 0;
}